

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_argb.cc
# Opt level: O0

int I420ToARGB1555(uint8_t *src_y,int src_stride_y,uint8_t *src_u,int src_stride_u,uint8_t *src_v,
                  int src_stride_v,uint8_t *dst_argb1555,int dst_stride_argb1555,int width,
                  int height)

{
  int iVar1;
  int in_ECX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  long in_R8;
  int in_R9D;
  _func_void_uint8_t_ptr_uint8_t_ptr_uint8_t_ptr_uint8_t_ptr_YuvConstants_ptr_int *I422ToARGB1555Row
  ;
  int y;
  int in_stack_00000020;
  code *pcVar2;
  uint local_38;
  long local_30;
  long local_20;
  long local_10;
  int local_4;
  
  pcVar2 = I422ToARGB1555Row_C;
  if (((((in_RDI == 0) || (in_RDX == 0)) || (in_R8 == 0)) ||
      ((I422ToARGB1555Row ==
        (_func_void_uint8_t_ptr_uint8_t_ptr_uint8_t_ptr_uint8_t_ptr_YuvConstants_ptr_int *)0x0 ||
       ((int)src_v < 1)))) || (in_stack_00000020 == 0)) {
    local_4 = -1;
  }
  else {
    if (in_stack_00000020 < 0) {
      in_stack_00000020 = -in_stack_00000020;
      I422ToARGB1555Row = I422ToARGB1555Row + (in_stack_00000020 + -1) * y;
      y = -y;
    }
    iVar1 = libyuv::TestCpuFlag(0);
    if ((iVar1 != 0) && (pcVar2 = I422ToARGB1555Row_Any_SSSE3, ((ulong)src_v & 7) == 0)) {
      pcVar2 = I422ToARGB1555Row_SSSE3;
    }
    iVar1 = libyuv::TestCpuFlag(0);
    if ((iVar1 != 0) && (pcVar2 = I422ToARGB1555Row_Any_AVX2, ((ulong)src_v & 0xf) == 0)) {
      pcVar2 = I422ToARGB1555Row_AVX2;
    }
    local_30 = in_R8;
    local_20 = in_RDX;
    local_10 = in_RDI;
    for (local_38 = 0; (int)local_38 < in_stack_00000020; local_38 = local_38 + 1) {
      (*pcVar2)(local_10,local_20,local_30,I422ToARGB1555Row,&kYuvI601Constants,
                (ulong)src_v & 0xffffffff);
      I422ToARGB1555Row = I422ToARGB1555Row + y;
      local_10 = local_10 + in_ESI;
      if ((local_38 & 1) != 0) {
        local_20 = local_20 + in_ECX;
        local_30 = local_30 + in_R9D;
      }
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

LIBYUV_API
int I420ToARGB1555(const uint8_t* src_y,
                   int src_stride_y,
                   const uint8_t* src_u,
                   int src_stride_u,
                   const uint8_t* src_v,
                   int src_stride_v,
                   uint8_t* dst_argb1555,
                   int dst_stride_argb1555,
                   int width,
                   int height) {
  int y;
  void (*I422ToARGB1555Row)(const uint8_t* y_buf, const uint8_t* u_buf,
                            const uint8_t* v_buf, uint8_t* rgb_buf,
                            const struct YuvConstants* yuvconstants,
                            int width) = I422ToARGB1555Row_C;
  if (!src_y || !src_u || !src_v || !dst_argb1555 || width <= 0 ||
      height == 0) {
    return -1;
  }
  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    dst_argb1555 = dst_argb1555 + (height - 1) * dst_stride_argb1555;
    dst_stride_argb1555 = -dst_stride_argb1555;
  }
#if defined(HAS_I422TOARGB1555ROW_SSSE3)
  if (TestCpuFlag(kCpuHasSSSE3)) {
    I422ToARGB1555Row = I422ToARGB1555Row_Any_SSSE3;
    if (IS_ALIGNED(width, 8)) {
      I422ToARGB1555Row = I422ToARGB1555Row_SSSE3;
    }
  }
#endif
#if defined(HAS_I422TOARGB1555ROW_AVX2)
  if (TestCpuFlag(kCpuHasAVX2)) {
    I422ToARGB1555Row = I422ToARGB1555Row_Any_AVX2;
    if (IS_ALIGNED(width, 16)) {
      I422ToARGB1555Row = I422ToARGB1555Row_AVX2;
    }
  }
#endif
#if defined(HAS_I422TOARGB1555ROW_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    I422ToARGB1555Row = I422ToARGB1555Row_Any_NEON;
    if (IS_ALIGNED(width, 8)) {
      I422ToARGB1555Row = I422ToARGB1555Row_NEON;
    }
  }
#endif
#if defined(HAS_I422TOARGB1555ROW_MMI)
  if (TestCpuFlag(kCpuHasMMI)) {
    I422ToARGB1555Row = I422ToARGB1555Row_Any_MMI;
    if (IS_ALIGNED(width, 4)) {
      I422ToARGB1555Row = I422ToARGB1555Row_MMI;
    }
  }
#endif
#if defined(HAS_I422TOARGB1555ROW_MSA)
  if (TestCpuFlag(kCpuHasMSA)) {
    I422ToARGB1555Row = I422ToARGB1555Row_Any_MSA;
    if (IS_ALIGNED(width, 8)) {
      I422ToARGB1555Row = I422ToARGB1555Row_MSA;
    }
  }
#endif

  for (y = 0; y < height; ++y) {
    I422ToARGB1555Row(src_y, src_u, src_v, dst_argb1555, &kYuvI601Constants,
                      width);
    dst_argb1555 += dst_stride_argb1555;
    src_y += src_stride_y;
    if (y & 1) {
      src_u += src_stride_u;
      src_v += src_stride_v;
    }
  }
  return 0;
}